

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

void __thiscall QHexView::checkOptions(QHexView *this)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  ColorGroup CVar4;
  long *plVar5;
  double dVar6;
  
  uVar1 = (this->m_options).linelength;
  if (uVar1 < (this->m_options).grouplength) {
    (this->m_options).grouplength = uVar1;
  }
  uVar3 = calcAddressWidth(this);
  uVar1 = (this->m_options).addresswidth;
  if (uVar3 < uVar1) {
    uVar3 = uVar1;
  }
  (this->m_options).addresswidth = uVar3;
  dVar6 = floor((double)(this->m_options).grouplength * 0.5);
  (this->m_options).grouplength = 1 << ((byte)(int)dVar6 & 0x1f);
  if ((this->m_options).headercolor.cspec == Invalid) {
    CVar4 = QWidget::palette();
    plVar5 = (long *)QPalette::brush(CVar4,WindowText);
    uVar2 = *(undefined8 *)(*plVar5 + 0xe);
    *(undefined8 *)&(this->m_options).headercolor = *(undefined8 *)(*plVar5 + 8);
    *(undefined8 *)((long)&(this->m_options).headercolor.ct + 2) = uVar2;
  }
  return;
}

Assistant:

void QHexView::checkOptions() {
    if(m_options.grouplength > m_options.linelength)
        m_options.grouplength = m_options.linelength;

    m_options.addresswidth =
        qMax<unsigned int>(m_options.addresswidth, this->calcAddressWidth());

    // Round to nearest multiple of 2
    m_options.grouplength =
        1u << (static_cast<unsigned int>(qFloor(m_options.grouplength / 2.0)));

    if(m_options.grouplength <= 1)
        m_options.grouplength = 1;

    if(!m_options.headercolor.isValid())
        m_options.headercolor =
            this->palette().color(QPalette::Normal, QPalette::Highlight);
}